

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlUTF8Strlen(xmlChar *utf)

{
  int iVar1;
  xmlChar xVar2;
  
  if (utf == (xmlChar *)0x0) {
LAB_001d7d39:
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    xVar2 = *utf;
    while (xVar2 != '\0') {
      utf = utf + 1;
      if ((char)xVar2 < '\0') goto LAB_001d7d39;
      iVar1 = iVar1 + 1;
      xVar2 = *utf;
    }
  }
  return iVar1;
}

Assistant:

int
xmlUTF8Strlen(const xmlChar *utf) {
    int ret = 0;

    if (utf == NULL)
        return(-1);

    while (*utf != 0) {
        if (utf[0] & 0x80) {
            if ((utf[1] & 0xc0) != 0x80)
                return(-1);
            if ((utf[0] & 0xe0) == 0xe0) {
                if ((utf[2] & 0xc0) != 0x80)
                    return(-1);
                if ((utf[0] & 0xf0) == 0xf0) {
                    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                        return(-1);
                    utf += 4;
                } else {
                    utf += 3;
                }
            } else {
                utf += 2;
            }
        } else {
            utf++;
        }
        ret++;
    }
    return(ret);
}